

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ErrorMsg(Parse *pParse,char *zFormat,...)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  char *in_RCX;
  __va_list_tag *in_RDX;
  long *in_RDI;
  sqlite3 *in_R8;
  long in_FS_OFFSET;
  sqlite3 *db;
  char *zMsg;
  va_list ap;
  void *in_stack_ffffffffffffff08;
  sqlite3 *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *in_RDI;
  *(undefined4 *)(lVar2 + 0x54) = 0xfffffffe;
  pcVar3 = sqlite3VMPrintf(in_R8,in_RCX,in_RDX);
  if (*(int *)(lVar2 + 0x54) < -1) {
    *(undefined4 *)(lVar2 + 0x54) = 0xffffffff;
  }
  if (*(char *)(lVar2 + 0x6b) == '\0') {
    *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
    sqlite3DbFree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    in_RDI[1] = (long)pcVar3;
    *(undefined4 *)(in_RDI + 3) = 1;
    in_RDI[0x33] = 0;
  }
  else {
    sqlite3DbFree(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
    if (*(char *)(lVar2 + 0x67) != '\0') {
      *(int *)((long)in_RDI + 0x34) = *(int *)((long)in_RDI + 0x34) + 1;
      *(undefined4 *)(in_RDI + 3) = 7;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_PRIVATE void sqlite3ErrorMsg(Parse *pParse, const char *zFormat, ...){
  char *zMsg;
  va_list ap;
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  assert( db->pParse==pParse || db->pParse->pToplevel==pParse );
  db->errByteOffset = -2;
  va_start(ap, zFormat);
  zMsg = sqlite3VMPrintf(db, zFormat, ap);
  va_end(ap);
  if( db->errByteOffset<-1 ) db->errByteOffset = -1;
  if( db->suppressErr ){
    sqlite3DbFree(db, zMsg);
    if( db->mallocFailed ){
      pParse->nErr++;
      pParse->rc = SQLITE_NOMEM;
    }
  }else{
    pParse->nErr++;
    sqlite3DbFree(db, pParse->zErrMsg);
    pParse->zErrMsg = zMsg;
    pParse->rc = SQLITE_ERROR;
    pParse->pWith = 0;
  }
}